

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_138c18::SQLiteBuildDB::lookupRuleResult
          (SQLiteBuildDB *this,KeyID keyID,KeyType *key,Result *result_out,string *error_out)

{
  sqlite3_stmt *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer pvVar5;
  char *pcVar6;
  size_t sVar7;
  uint64_t uVar8;
  uchar *puVar9;
  void *pvVar10;
  Epoch EVar11;
  KeyID *pKVar12;
  DBKeyID *pDVar13;
  size_t __nbytes;
  ulong uVar14;
  KeyID id;
  ulong uVar15;
  int __oflag;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Timestamp TVar16;
  KeyID keyID_1;
  DBKeyID dbKeyID_1;
  bool singleUse;
  ulong uStack_280;
  bool orderOnly;
  uint64_t raw;
  undefined1 auStack_270 [4];
  int i;
  size_t local_268;
  undefined1 local_260 [8];
  BinaryDecoder decoder;
  Twine local_230;
  Twine local_218;
  string local_200;
  int local_1dc;
  CommandSignature CStack_1d8;
  int numDependencies;
  int local_1cc;
  DBKeyID DStack_1c8;
  int numValueBytes_1;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  CommandSignature local_140;
  int local_134;
  DBKeyID DStack_130;
  int numValueBytes;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  iterator local_a8;
  ConstIterator local_98;
  undefined1 local_88 [8];
  iterator it;
  DBKeyID dbKeyID;
  void *dependencyBytes;
  int numDependencyBytes;
  int result;
  lock_guard<std::mutex> guard;
  string *error_out_local;
  Result *result_out_local;
  KeyType *key_local;
  SQLiteBuildDB *this_local;
  KeyID keyID_local;
  
  guard._M_device = (mutex_type *)error_out;
  this_local = (SQLiteBuildDB *)keyID._value;
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c3,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&result,&this->dbMutex);
  if (result_out->builtAt != 0) {
    __assert_fail("result_out->builtAt == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c5,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  uVar3 = open(this,(char *)guard._M_device,__oflag);
  if ((uVar3 & 1) == 0) {
    keyID_local._value._7_1_ = 0;
    goto LAB_001bab31;
  }
  DBKeyID::DBKeyID((DBKeyID *)&it.End);
  _local_88 = llvm::
              DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
              ::find((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                      *)&this->dbKeyIDs,(const_arg_type_t<llbuild::core::KeyID>)&this_local);
  local_a8 = llvm::
             DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
             ::end((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                    *)&this->dbKeyIDs);
  llvm::
  DenseMapIterator<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>,true>
  ::DenseMapIterator<false,void>
            ((DenseMapIterator<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>,true>
              *)&local_98,&local_a8);
  bVar2 = llvm::
          DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
          ::operator!=((DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
                        *)local_88,&local_98);
  if (bVar2) {
    iVar4 = sqlite3_reset(this->fastFindRuleResultStmt);
    if (iVar4 != 0) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c8,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    iVar4 = sqlite3_clear_bindings(this->fastFindRuleResultStmt);
    if (iVar4 != 0) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_e8,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    psVar1 = this->fastFindRuleResultStmt;
    pvVar5 = llvm::
             DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
             ::operator->((DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
                           *)local_88);
    iVar4 = sqlite3_bind_int64(psVar1,1,(pvVar5->super_pair<llbuild::core::KeyID,_DBKeyID>).second.
                                        value);
    if (iVar4 != 0) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_108,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    iVar4 = sqlite3_step(this->fastFindRuleResultStmt);
    if (iVar4 == 0x65) {
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    if (iVar4 != 100) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_128,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    iVar4 = sqlite3_column_count(this->fastFindRuleResultStmt);
    if (iVar4 != 8) {
      __assert_fail("sqlite3_column_count(fastFindRuleResultStmt) == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                    ,0x1e8,
                    "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                   );
    }
    uVar8 = sqlite3_column_int64(this->fastFindRuleResultStmt,0);
    DBKeyID::DBKeyID(&stack0xfffffffffffffed0,uVar8);
    it.End = (pointer)DStack_130.value;
    local_134 = sqlite3_column_bytes(this->fastFindRuleResultStmt,1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&result_out->value,(long)local_134);
    puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&result_out->value);
    pvVar10 = (void *)sqlite3_column_blob(this->fastFindRuleResultStmt,1);
    memcpy(puVar9,pvVar10,(long)local_134);
    EVar11 = sqlite3_column_int64(this->fastFindRuleResultStmt,2);
    result_out->builtAt = EVar11;
    EVar11 = sqlite3_column_int64(this->fastFindRuleResultStmt,3);
    result_out->computedAt = EVar11;
    TVar16 = (Timestamp)sqlite3_column_double(this->fastFindRuleResultStmt,4);
    result_out->start = TVar16;
    TVar16 = (Timestamp)sqlite3_column_double(this->fastFindRuleResultStmt,5);
    result_out->end = TVar16;
    dependencyBytes._4_4_ = sqlite3_column_bytes(this->fastFindRuleResultStmt,6);
    dbKeyID.value = sqlite3_column_blob(this->fastFindRuleResultStmt,6);
    uVar8 = sqlite3_column_int64(this->fastFindRuleResultStmt,7);
    llbuild::basic::CommandSignature::CommandSignature(&local_140,uVar8);
    (result_out->signature).value = local_140.value;
  }
  else {
    iVar4 = sqlite3_reset(this->findRuleResultStmt);
    if (iVar4 != 0) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_160,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    iVar4 = sqlite3_clear_bindings(this->findRuleResultStmt);
    if (iVar4 != 0) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_180,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    psVar1 = this->findRuleResultStmt;
    pcVar6 = llbuild::core::KeyType::data(key);
    sVar7 = llbuild::core::KeyType::size(key);
    iVar4 = sqlite3_bind_text(psVar1,1,pcVar6,sVar7 & 0xffffffff,0);
    if (iVar4 != 0) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_1a0,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    iVar4 = sqlite3_step(this->findRuleResultStmt);
    if (iVar4 == 0x65) {
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    if (iVar4 != 100) {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_1c0,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      keyID_local._value._7_1_ = 0;
      goto LAB_001bab31;
    }
    iVar4 = sqlite3_column_count(this->findRuleResultStmt);
    if (iVar4 != 8) {
      __assert_fail("sqlite3_column_count(findRuleResultStmt) == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                    ,0x211,
                    "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                   );
    }
    uVar8 = sqlite3_column_int64(this->findRuleResultStmt,0);
    DBKeyID::DBKeyID(&stack0xfffffffffffffe38,uVar8);
    it.End = (pointer)DStack_1c8.value;
    local_1cc = sqlite3_column_bytes(this->findRuleResultStmt,1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&result_out->value,(long)local_1cc);
    puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&result_out->value);
    pvVar10 = (void *)sqlite3_column_blob(this->findRuleResultStmt,1);
    memcpy(puVar9,pvVar10,(long)local_1cc);
    EVar11 = sqlite3_column_int64(this->findRuleResultStmt,2);
    result_out->builtAt = EVar11;
    EVar11 = sqlite3_column_int64(this->findRuleResultStmt,3);
    result_out->computedAt = EVar11;
    TVar16 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,4);
    result_out->start = TVar16;
    TVar16 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,5);
    result_out->end = TVar16;
    pKVar12 = llvm::
              DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
              ::operator[]((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                            *)&this->engineKeyIDs,(DBKeyID *)&it.End);
    pKVar12->_value = (ValueTy)this_local;
    pDVar13 = llvm::
              DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
              ::operator[]((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                            *)&this->dbKeyIDs,(KeyID *)&this_local);
    pDVar13->value = (uint64_t)it.End;
    dependencyBytes._4_4_ = sqlite3_column_bytes(this->findRuleResultStmt,6);
    dbKeyID.value = sqlite3_column_blob(this->findRuleResultStmt,6);
    uVar8 = sqlite3_column_int64(this->findRuleResultStmt,7);
    llbuild::basic::CommandSignature::CommandSignature(&stack0xfffffffffffffe28,uVar8);
    (result_out->signature).value = CStack_1d8.value;
  }
  local_1dc = (int)((ulong)(long)dependencyBytes._4_4_ >> 3);
  if (dependencyBytes._4_4_ == local_1dc << 3) {
    llbuild::core::DependencyKeyIDs::resize(&result_out->dependencies,(long)local_1dc);
    __nbytes = (size_t)dependencyBytes._4_4_;
    _auStack_270 = dbKeyID.value;
    local_268 = __nbytes;
    llbuild::basic::BinaryDecoder::BinaryDecoder((BinaryDecoder *)local_260,_auStack_270);
    pvVar10 = extraout_RDX;
    for (raw._4_4_ = 0; raw._4_4_ != local_1dc; raw._4_4_ = raw._4_4_ + 1) {
      llbuild::basic::BinaryDecoder::read
                ((BinaryDecoder *)local_260,(int)&stack0xfffffffffffffd80,pvVar10,__nbytes);
      bVar2 = (uStack_280 & 1) != 0;
      uVar14 = uStack_280 >> 1;
      DBKeyID::DBKeyID((DBKeyID *)&keyID_1,uStack_280 >> 2);
      id = getKeyIDForID(this,keyID_1._value,(string *)guard._M_device);
      uVar15 = std::__cxx11::string::empty();
      if ((uVar15 & 1) == 0) {
        keyID_local._value._7_1_ = 0;
        goto LAB_001bab31;
      }
      __nbytes = (size_t)bVar2;
      llbuild::core::DependencyKeyIDs::set
                (&result_out->dependencies,(long)raw._4_4_,id,bVar2,(uVar14 & 1) != 0);
      pvVar10 = extraout_RDX_00;
    }
    keyID_local._value._7_1_ = 1;
  }
  else {
    llvm::Twine::Twine(&local_230,"unexpected contents for database result: ");
    llvm::Twine::Twine((Twine *)&decoder.pos,(int)it.End);
    llvm::operator+(&local_218,&local_230,(Twine *)&decoder.pos);
    llvm::Twine::str_abi_cxx11_(&local_200,&local_218);
    std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    keyID_local._value._7_1_ = 0;
  }
LAB_001bab31:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&result);
  return (bool)(keyID_local._value._7_1_ & 1);
}

Assistant:

virtual bool lookupRuleResult(KeyID keyID, const KeyType& key,
                                Result* result_out,
                                std::string *error_out) override {
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    assert(result_out->builtAt == 0);

    if (!open(error_out)) {
      return false;
    }

    // Fetch the basic rule information.
    int result;
    int numDependencyBytes = 0;
    const void* dependencyBytes = nullptr;
    DBKeyID dbKeyID;

    // Check if we already have the key mapping
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      // DBKeyID is known, perform the fast path that avoids table joining

      result = sqlite3_reset(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_int64(fastFindRuleResultStmt, /*index=*/1,
                                  it->second.value);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(fastFindRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(fastFindRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(fastFindRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(fastFindRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(fastFindRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(fastFindRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(fastFindRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(fastFindRuleResultStmt, 5);

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(fastFindRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(fastFindRuleResultStmt, 7));
    } else {
      // KeyID is not known, perform the 'normal' search using the key value

      result = sqlite3_reset(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_text(findRuleResultStmt, /*index=*/1,
                                 key.data(), key.size(),
                                 SQLITE_STATIC);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(findRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(findRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(findRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(findRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(findRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(findRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(findRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(findRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(findRuleResultStmt, 5);

      // Cache the engine key mapping
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(findRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(findRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(findRuleResultStmt, 7));
    }


    int numDependencies = numDependencyBytes / sizeof(uint64_t);
    if (numDependencyBytes != static_cast<int>(numDependencies * sizeof(uint64_t))) {
      *error_out = (llvm::Twine("unexpected contents for database result: ") +
                    llvm::Twine((int)dbKeyID.value)).str();
      return false;
    }
    result_out->dependencies.resize(numDependencies);
    basic::BinaryDecoder decoder(
        StringRef((const char*)dependencyBytes, numDependencyBytes));
    for (auto i = 0; i != numDependencies; ++i) {
      uint64_t raw;
      decoder.read(raw);
      bool orderOnly = raw & 1;
      bool singleUse = (raw >> 1) & 1;
      DBKeyID dbKeyID(raw >> 2);

      // Map the database key ID into an engine key ID (note that we already
      // hold the dbMutex at this point as required by getKeyIDforID())
      KeyID keyID = getKeyIDForID(dbKeyID, error_out);
      if (!error_out->empty()) {
        return false;
      }
      result_out->dependencies.set(i, keyID, orderOnly, singleUse);
    }

    return true;
  }